

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_pcg.c
# Opt level: O0

SUNErrCode SUNLinSolInitialize_PCG(SUNLinearSolver S)

{
  SUNContext_conflict sunctx_local_scope_;
  SUNLinearSolver S_local;
  
  if (*S->content < 1) {
    *(undefined4 *)S->content = 5;
  }
  if (((*(int *)((long)S->content + 4) != 1) && (*(int *)((long)S->content + 4) != 2)) &&
     (*(int *)((long)S->content + 4) != 3)) {
    *(undefined4 *)((long)S->content + 4) = 0;
  }
  return 0;
}

Assistant:

SUNErrCode SUNLinSolInitialize_PCG(SUNLinearSolver S)
{
  SUNFunctionBegin(S->sunctx);
  if (PCG_CONTENT(S)->maxl <= 0) { PCG_CONTENT(S)->maxl = SUNPCG_MAXL_DEFAULT; }

  SUNAssert(PCG_CONTENT(S)->ATimes, SUN_ERR_ARG_CORRUPT);

  if ((PRETYPE(S) != SUN_PREC_LEFT) && (PRETYPE(S) != SUN_PREC_RIGHT) &&
      (PRETYPE(S) != SUN_PREC_BOTH))
  {
    PRETYPE(S) = SUN_PREC_NONE;
  }

  SUNAssert((PCG_CONTENT(S)->pretype == SUN_PREC_NONE) ||
              (PCG_CONTENT(S)->Psolve != NULL),
            SUN_ERR_ARG_CORRUPT);

  /* no additional memory to allocate */

  return SUN_SUCCESS;
}